

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O1

bool woff2::anon_unknown_4::WriteNormalizedLoca(int index_fmt,int num_glyphs,Font *font)

{
  bool bVar1;
  ushort uVar2;
  Table *pTVar3;
  ulong uVar4;
  pointer puVar5;
  uint8_t *puVar6;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  int glyph_index;
  bool bVar13;
  size_t glyf_dst_size;
  size_t glyph_size;
  uint8_t *glyph_data;
  Glyph glyph;
  ulong local_b8;
  Table *local_b0;
  pointer local_a8;
  ulong local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_98;
  Table *local_90;
  Font *local_88;
  size_t local_80;
  uint8_t *local_78;
  Glyph local_70;
  
  pTVar3 = Font::FindTable(font,0x676c7966);
  local_b0 = pTVar3;
  local_88 = font;
  local_90 = Font::FindTable(font,0x6c6f6361);
  local_98 = &local_90->buffer;
  uVar9 = num_glyphs + 1;
  uVar10 = (num_glyphs & 0xfffffffcU) + 4;
  if (0xfffffffc < (uVar9 | 0x80000000)) {
    uVar10 = uVar9;
  }
  bVar7 = 2 - (index_fmt == 0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_98,(long)(int)(uVar10 << (bVar7 & 0x1f)));
  local_90->length = uVar9 << (bVar7 & 0x1f);
  uVar10 = 0;
  if (num_glyphs == 0) {
    local_a8 = (pointer)0x0;
  }
  else {
    local_a8 = (pTVar3->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  }
  puVar5 = (local_98->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar8 = num_glyphs < 1;
  local_a0 = (ulong)(uint)num_glyphs;
  if (num_glyphs < 1) {
    lVar11 = 0;
  }
  else {
    glyph_index = 0;
    uVar10 = 0;
    lVar11 = 0;
    do {
      if (index_fmt == 0) {
        uVar2 = (ushort)(uVar10 >> 1);
        *(ushort *)(puVar5 + lVar11) = uVar2 << 8 | uVar2 >> 8;
        lVar11 = lVar11 + 2;
      }
      else {
        *(uint *)(puVar5 + lVar11) =
             uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
        lVar11 = lVar11 + 4;
      }
      local_70.instructions_size = 0;
      local_70.contours.
      super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_70.contours.
      super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_70.contours.
      super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70.composite_data_size = 0;
      bVar1 = GetGlyphData(local_88,glyph_index,&local_78,&local_80);
      if ((bVar1) && ((local_80 == 0 || (bVar1 = ReadGlyph(local_78,local_80,&local_70), bVar1)))) {
        uVar12 = (ulong)uVar10;
        local_b8 = (long)(pTVar3->buffer).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)((pTVar3->buffer).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar12);
        bVar1 = StoreGlyph(&local_70,local_a8 + uVar12,&local_b8);
        if (!bVar1) goto LAB_0010916b;
        uVar4 = local_b8 + 3 & 0xfffffffffffffffc;
        if (0xfffffffffffffffc < local_b8) {
          uVar4 = local_b8;
        }
        local_b8 = uVar4;
        if ((uVar4 >> 0x20 != 0) || (CARRY4(uVar10,(uint)uVar4))) goto LAB_0010916b;
        bVar13 = uVar4 + uVar12 < 0x20000;
        bVar1 = bVar13 || index_fmt != 0;
        uVar9 = 0;
        if (bVar13 || index_fmt != 0) {
          uVar9 = (uint)uVar4;
        }
        uVar10 = uVar10 + uVar9;
      }
      else {
LAB_0010916b:
        bVar1 = false;
      }
      std::
      vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
      ::~vector(&local_70.contours);
      if (!bVar1) break;
      glyph_index = glyph_index + 1;
      bVar8 = (int)local_a0 <= glyph_index;
    } while (glyph_index != (int)local_a0);
  }
  if (bVar8 != false) {
    if (index_fmt == 0) {
      uVar2 = (ushort)(uVar10 >> 1);
      *(ushort *)(puVar5 + lVar11) = uVar2 << 8 | uVar2 >> 8;
      lVar11 = lVar11 + 2;
    }
    else {
      *(uint *)(puVar5 + lVar11) =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      lVar11 = lVar11 + 4;
    }
    this = &local_b0->buffer;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(ulong)uVar10);
    if (uVar10 == 0) {
      puVar5 = (pointer)0x0;
    }
    else {
      puVar5 = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pTVar3->data = puVar5;
    pTVar3->length = uVar10;
    if (lVar11 == 0) {
      puVar6 = (uint8_t *)0x0;
    }
    else {
      puVar6 = (local_98->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
    }
    local_90->data = puVar6;
  }
  return bVar8;
}

Assistant:

bool WriteNormalizedLoca(int index_fmt, int num_glyphs, Font* font) {
  Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  Font::Table* loca_table = font->FindTable(kLocaTableTag);

  int glyph_sz = index_fmt == 0 ? 2 : 4;
  loca_table->buffer.resize(Round4(num_glyphs + 1) * glyph_sz);
  loca_table->length = (num_glyphs + 1) * glyph_sz;

  uint8_t* glyf_dst = num_glyphs ? &glyf_table->buffer[0] : NULL;
  uint8_t* loca_dst = &loca_table->buffer[0];
  uint32_t glyf_offset = 0;
  size_t loca_offset = 0;

  for (int i = 0; i < num_glyphs; ++i) {
    StoreLoca(index_fmt, glyf_offset, &loca_offset, loca_dst);
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }
    size_t glyf_dst_size = glyf_table->buffer.size() - glyf_offset;
    if (!StoreGlyph(glyph, glyf_dst + glyf_offset, &glyf_dst_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyf_dst_size = Round4(glyf_dst_size);
    if (glyf_dst_size > std::numeric_limits<uint32_t>::max() ||
        glyf_offset + static_cast<uint32_t>(glyf_dst_size) < glyf_offset ||
        (index_fmt == 0 && glyf_offset + glyf_dst_size >= (1UL << 17))) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyf_offset += glyf_dst_size;
  }

  StoreLoca(index_fmt, glyf_offset, &loca_offset, loca_dst);

  glyf_table->buffer.resize(glyf_offset);
  glyf_table->data = glyf_offset ? &glyf_table->buffer[0] : NULL;
  glyf_table->length = glyf_offset;
  loca_table->data = loca_offset ? &loca_table->buffer[0] : NULL;

  return true;
}